

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O3

void __thiscall ymfm::ym3526::generate(ym3526 *this,output_data *output,uint32_t numsamples)

{
  if (numsamples != 0) {
    do {
      fm_engine_base<ymfm::opl_registers_base<1>_>::clock(&this->m_fm);
      output->data[0] = 0;
      fm_engine_base<ymfm::opl_registers_base<1>_>::output(&this->m_fm,output,1,0x7fff,0x1ff);
      ymfm_output<1>::roundtrip_fp(output);
      output = output + 1;
      numsamples = numsamples - 1;
    } while (numsamples != 0);
  }
  return;
}

Assistant:

void ym3526::generate(output_data *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		// clock the system
		m_fm.clock(fm_engine::ALL_CHANNELS);

		// update the FM content; mixing details for YM3526 need verification
		m_fm.output(output->clear(), 1, 32767, fm_engine::ALL_CHANNELS);

		// YM3526 uses an external DAC (YM3014) with mantissa/exponent format
		// convert to 10.3 floating point value and back to simulate truncation
		output->roundtrip_fp();
	}
}